

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::apply_undo(CVmObjDict *this,CVmUndoRecord *undo_rec)

{
  int iVar1;
  char *in_RSI;
  CVmObjDict *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  CVmObjDict *in_stack_00000010;
  dict_undo_rec *rec;
  vm_obj_id_t obj;
  int *__ptr;
  
  if (*(long *)(in_RSI + 8) != 0) {
    __ptr = *(int **)(in_RSI + 8);
    iVar1 = *__ptr;
    obj = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
    if (iVar1 == 0) {
      del_hash_entry(in_RDI,in_RSI,(size_t)__ptr,obj,(vm_prop_id_t)((ulong)in_RDI >> 0x10));
    }
    else if (iVar1 == 1) {
      add_hash_entry(in_stack_00000010,in_stack_00000008,unaff_retaddr,obj,(vm_obj_id_t)in_RDI,
                     (vm_prop_id_t)((ulong)in_RSI >> 0x30),(int)rec);
    }
    else if (iVar1 == 2) {
      set_comparator(in_RDI,2);
    }
    free(__ptr);
    in_RSI[8] = '\0';
    in_RSI[9] = '\0';
    in_RSI[10] = '\0';
    in_RSI[0xb] = '\0';
    in_RSI[0xc] = '\0';
    in_RSI[0xd] = '\0';
    in_RSI[0xe] = '\0';
    in_RSI[0xf] = '\0';
  }
  return;
}

Assistant:

void CVmObjDict::apply_undo(VMG_ CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        dict_undo_rec *rec;

        /* get my undo record */
        rec = (dict_undo_rec *)undo_rec->id.ptrval;

        /* take the appropriate action */
        switch(rec->action)
        {
        case DICT_UNDO_ADD:
            /* we added the word, so we must now delete it */
            del_hash_entry(vmg_ rec->txt, rec->len, rec->obj, rec->prop);
            break;

        case DICT_UNDO_DEL:
            /* we deleted the word, so now we must add it */
            add_hash_entry(vmg_ rec->txt, rec->len, TRUE,
                           rec->obj, rec->prop, FALSE);
            break;

        case DICT_UNDO_COMPARATOR:
            /* we changed the comparator object, so change it back */
            set_comparator(vmg_ rec->obj);
            break;
        }

        /* discard my record */
        t3free(rec);

        /* clear the pointer in the undo record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}